

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O0

cmJSONHelper<unsigned_int,_(anonymous_namespace)::ErrorCode> *
cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::UInt
          (cmJSONHelper<unsigned_int,_(anonymous_namespace)::ErrorCode> *__return_storage_ptr__,
          ErrorCode success,ErrorCode fail,uint defval)

{
  anon_class_12_3_5a0d8fdd local_28;
  uint local_1c;
  ErrorCode local_18;
  uint defval_local;
  ErrorCode fail_local;
  ErrorCode success_local;
  
  local_28.success = success;
  local_28.fail = fail;
  local_28.defval = defval;
  local_1c = defval;
  local_18 = fail;
  defval_local = success;
  _fail_local = __return_storage_ptr__;
  std::function<(anonymous_namespace)::ErrorCode(unsigned_int&,Json::Value_const*)>::
  function<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::UInt((anonymous_namespace)::ErrorCode,(anonymous_namespace)::ErrorCode,unsigned_int)::_lambda(unsigned_int&,Json::Value_const*)_1_,void>
            ((function<(anonymous_namespace)::ErrorCode(unsigned_int&,Json::Value_const*)> *)
             __return_storage_ptr__,&local_28);
  return __return_storage_ptr__;
}

Assistant:

static cmJSONHelper<unsigned int, E, CallState...> UInt(
    E success, E fail, unsigned int defval = 0)
  {
    return [success, fail, defval](unsigned int& out, const Json::Value* value,
                                   CallState&&... /*state*/) -> E {
      if (!value) {
        out = defval;
        return success;
      }
      if (!value->isUInt()) {
        return fail;
      }
      out = value->asUInt();
      return success;
    };
  }